

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCDecoder.cpp
# Opt level: O3

void ZXing::MaxiCode::DecodedBitStreamParser::GetMessage
               (ByteArray *bytes,int start,int len,Content *result,StructuredAppendInfo *sai)

{
  byte bVar1;
  pointer puVar2;
  int iVar3;
  ECI EVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ECI EVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar16;
  bool bVar17;
  string local_68;
  long local_48;
  StructuredAppendInfo *local_40;
  ByteArray *local_38;
  long lVar15;
  
  if (len < 1) {
    return;
  }
  local_48 = (long)start + 1;
  iVar8 = -1;
  iVar16 = 0;
  iVar12 = 0;
  iVar13 = start;
  local_40 = sai;
  local_38 = bytes;
LAB_0015a89b:
  puVar2 = (bytes->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (ulong)puVar2[iVar13];
  if (0x3f < uVar11) {
    std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar11,0x40)
    ;
  }
  iVar6 = *(ushort *)(CHARSETS + uVar11 * 2 + (long)iVar16 * 0x80) - 0x100;
  iVar3 = -2;
  switch(iVar6) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
    iVar8 = 0;
    iVar12 = iVar16;
    break;
  case 5:
    iVar3 = 1;
    iVar12 = iVar16;
  case 7:
switchD_0015a8d9_caseD_7:
    iVar8 = iVar3;
    iVar6 = 0;
    break;
  case 6:
    iVar3 = 2;
    iVar12 = iVar16;
    goto switchD_0015a8d9_caseD_7;
  case 8:
    iVar8 = iVar3;
    iVar6 = 1;
    break;
  case 9:
    goto switchD_0015a8d9_caseD_9;
  case 10:
    bVar1 = puVar2[(long)iVar13 + 1];
    EVar10 = (ECI)bVar1;
    if ((bVar1 & 0x20) == 0) {
      iVar13 = iVar13 + 1;
    }
    else {
      EVar4 = (ECI)puVar2[(long)iVar13 + 2];
      uVar9 = (uint)bVar1;
      if ((bVar1 & 0x10) == 0) {
        iVar3 = 2;
        EVar10 = (uVar9 & 0xf) << 6;
      }
      else {
        lVar14 = (long)iVar13;
        if ((bVar1 & 8) != 0) {
          lVar15 = (long)iVar13;
          iVar13 = iVar13 + 4;
          EVar10 = (uint)puVar2[lVar14 + 3] << 6 | EVar4 << 0xc | (uVar9 & 3) << 0x12 |
                   (uint)puVar2[lVar15 + 4];
          goto LAB_0015aa25;
        }
        iVar3 = 3;
        EVar10 = (uVar9 & 7) << 0xc;
        EVar4 = EVar4 << 6 | (uint)puVar2[lVar14 + 3];
      }
      iVar13 = iVar13 + iVar3;
      EVar10 = EVar10 | EVar4;
    }
LAB_0015aa25:
    Content::switchEncoding(result,EVar10,true);
    goto LAB_0015aa34;
  case 0xb:
    ToString<int,void>(&local_68,
                       (ZXing *)(ulong)((uint)puVar2[(long)iVar13 + 5] +
                                       (uint)puVar2[(long)iVar13 + 4] * 0x40 +
                                       (uint)puVar2[(long)iVar13 + 3] * 0x1000 +
                                       (uint)puVar2[(long)iVar13 + 2] * 0x40000 +
                                       (uint)puVar2[(long)iVar13 + 1] * 0x1000000),9,(int)puVar2);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)result,
               (result->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,local_68._M_dataplus._M_p,
               local_68._M_dataplus._M_p + local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    iVar13 = iVar13 + 5;
    goto LAB_0015aa34;
  case 0xc:
    if (iVar13 == start) {
      bVar1 = puVar2[local_48];
      uVar7 = bVar1 >> 3 & 7;
      uVar5 = bVar1 & 7;
      uVar9 = uVar5 + 1;
      if (uVar5 < uVar7) {
        uVar9 = 0;
      }
      if ((bVar1 & 7) == 0) {
        uVar9 = uVar5;
      }
      local_40->index = uVar7;
      local_40->count = uVar9;
      iVar13 = (int)local_48;
    }
    goto switchD_0015a8d9_caseD_9;
  default:
    Content::push_back(result,(uint8_t)*(ushort *)(CHARSETS + uVar11 * 2 + (long)iVar16 * 0x80));
LAB_0015aa34:
    bVar17 = iVar8 == 0;
    iVar8 = iVar8 + -1;
    bytes = local_38;
    iVar6 = iVar16;
    if (bVar17) {
      iVar6 = iVar12;
    }
  }
LAB_0015aa53:
  iVar16 = iVar6;
  iVar13 = iVar13 + 1;
  if (len + start <= iVar13) {
    return;
  }
  goto LAB_0015a89b;
switchD_0015a8d9_caseD_9:
  iVar8 = iVar3;
  iVar6 = iVar16;
  goto LAB_0015aa53;
}

Assistant:

static void GetMessage(const ByteArray& bytes, int start, int len, Content& result, StructuredAppendInfo& sai)
{
	int shift = -1;
	int set = 0;
	int lastset = 0;

	for (int i = start; i < start + len; i++) {
		int c = CHARSETS[set].at(bytes[i]);
		switch (c) {
		case LCHA:
			set   = 0;
			shift = -1;
			break;
		case LCHB:
			set   = 1;
			shift = -1;
			break;
		case SHI0:
		case SHI1:
		case SHI2:
		case SHI3:
		case SHI4:
			lastset = set;
			set     = c - SHI0;
			shift   = 1;
			break;
		case TWSA:
			lastset = set;
			set     = 0;
			shift   = 2;
			break;
		case TRSA:
			lastset = set;
			set     = 0;
			shift   = 3;
			break;
		case NS:
			result.append(
				ToString((bytes[i + 1] << 24) + (bytes[i + 2] << 18) + (bytes[i + 3] << 12) + (bytes[i + 4] << 6) + bytes[i + 5], 9));
			i += 5;
			break;
		case LOCK: shift = -1; break;
		case ECI: result.switchEncoding(ParseECIValue(bytes, i)); break;
		case PAD:
			if (i == start)
				ParseStructuredAppend(bytes, i, sai);
			shift = -1;
			break;
		default: result.push_back(c);
		}

		if (shift-- == 0)
			set = lastset;
	}
}